

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O0

void anon_unknown.dwarf_dfd021::anon_unknown_0::WriteMessageEvent
               (cmConfigureLog *log,cmMakefile *mf,string *message)

{
  initializer_list<unsigned_long> __l;
  cmMakefile *pcVar1;
  bool bVar2;
  int iVar3;
  string_view key;
  allocator<char> local_71;
  string local_70;
  allocator<unsigned_long> local_39;
  unsigned_long local_38;
  iterator local_30;
  size_type local_28;
  string *local_20;
  string *message_local;
  cmMakefile *mf_local;
  cmConfigureLog *log_local;
  
  local_20 = message;
  message_local = (string *)mf;
  mf_local = (cmMakefile *)log;
  if (((anonymous_namespace)::(anonymous_namespace)::
       WriteMessageEvent(cmConfigureLog&,cmMakefile_const&,std::__cxx11::string_const&)::
       LogVersionsWithMessageV1 == '\0') &&
     (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::(anonymous_namespace)::
                                   WriteMessageEvent(cmConfigureLog&,cmMakefile_const&,std::__cxx11::string_const&)
                                   ::LogVersionsWithMessageV1), iVar3 != 0)) {
    local_38 = 1;
    local_30 = &local_38;
    local_28 = 1;
    std::allocator<unsigned_long>::allocator(&local_39);
    __l._M_len = local_28;
    __l._M_array = local_30;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&WriteMessageEvent::LogVersionsWithMessageV1,__l,&local_39);
    std::allocator<unsigned_long>::~allocator(&local_39);
    __cxa_atexit(std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector,
                 &WriteMessageEvent::LogVersionsWithMessageV1,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::(anonymous_namespace)::
                         WriteMessageEvent(cmConfigureLog&,cmMakefile_const&,std::__cxx11::string_const&)
                         ::LogVersionsWithMessageV1);
  }
  bVar2 = cmConfigureLog::IsAnyLogVersionEnabled
                    ((cmConfigureLog *)mf_local,&WriteMessageEvent::LogVersionsWithMessageV1);
  pcVar1 = mf_local;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"message-v1",&local_71);
    cmConfigureLog::BeginEvent((cmConfigureLog *)pcVar1,&local_70,(cmMakefile *)message_local);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    pcVar1 = mf_local;
    key = (string_view)::cm::operator____s("message",7);
    cmConfigureLog::WriteLiteralTextBlock((cmConfigureLog *)pcVar1,key,local_20);
    cmConfigureLog::EndEvent((cmConfigureLog *)mf_local);
  }
  return;
}

Assistant:

void WriteMessageEvent(cmConfigureLog& log, cmMakefile const& mf,
                       std::string const& message)
{
  // Keep in sync with cmFileAPIConfigureLog's DumpEventKindNames.
  static const std::vector<unsigned long> LogVersionsWithMessageV1{ 1 };

  if (log.IsAnyLogVersionEnabled(LogVersionsWithMessageV1)) {
    log.BeginEvent("message-v1", mf);
    log.WriteLiteralTextBlock("message"_s, message);
    log.EndEvent();
  }
}